

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

void __thiscall wallet::LegacyScriptPubKeyMan::MarkPreSplitKeys(LegacyScriptPubKeyMan *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  iterator __position;
  runtime_error *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long in_FS_OFFSET;
  int64_t index;
  CKeyPool keypool;
  int64_t local_e0;
  WalletBatch local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  size_type *local_a8;
  size_type local_a0;
  size_type local_98;
  undefined8 uStack_90;
  CKeyPool local_88;
  long local_38;
  WalletDatabase *pWVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar4 = (WalletDatabase *)CONCAT44(extraout_var,iVar3);
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_d8,pWVar4,1);
  __position._M_node =
       (this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  p_Var1 = &(this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.super__Rb_tree_header;
  local_d8.m_database = pWVar4;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      local_e0 = *(int64_t *)(__position._M_node + 1);
      CKeyPool::CKeyPool(&local_88);
      bVar2 = WalletBatch::ReadPool(&local_d8,local_e0,&local_88);
      if (!bVar2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"MarkPreSplitKeys","");
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_c8,": read keypool entry failed");
        local_a8 = (size_type *)(pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8 == paVar7) {
          local_98 = paVar7->_M_allocated_capacity;
          uStack_90 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_a8 = &local_98;
        }
        else {
          local_98 = paVar7->_M_allocated_capacity;
        }
        local_a0 = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(prVar5,(string *)&local_a8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_004cc8fc;
      }
      local_88.m_pre_split = true;
      bVar2 = WalletBatch::WritePool(&local_d8,local_e0,&local_88);
      if (!bVar2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"MarkPreSplitKeys","");
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_c8,": writing modified keypool entry failed");
        local_a8 = (size_type *)(pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8 == paVar7) {
          local_98 = paVar7->_M_allocated_capacity;
          uStack_90 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_a8 = &local_98;
        }
        else {
          local_98 = paVar7->_M_allocated_capacity;
        }
        local_a0 = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(prVar5,(string *)&local_a8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_004cc8fc;
      }
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 &(this->super_LegacyDataSPKM).set_pre_split_keypool,&local_e0);
      __position = std::
                   _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
                   erase_abi_cxx11_((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                                     *)&(this->super_LegacyDataSPKM).setExternalKeyPool,
                                    __position._M_node);
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
      local_d8.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_d8.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004cc8fc:
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::MarkPreSplitKeys()
{
    WalletBatch batch(m_storage.GetDatabase());
    for (auto it = setExternalKeyPool.begin(); it != setExternalKeyPool.end();) {
        int64_t index = *it;
        CKeyPool keypool;
        if (!batch.ReadPool(index, keypool)) {
            throw std::runtime_error(std::string(__func__) + ": read keypool entry failed");
        }
        keypool.m_pre_split = true;
        if (!batch.WritePool(index, keypool)) {
            throw std::runtime_error(std::string(__func__) + ": writing modified keypool entry failed");
        }
        set_pre_split_keypool.insert(index);
        it = setExternalKeyPool.erase(it);
    }
}